

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.h
# Opt level: O1

void __thiscall
icu_63::DecimalFormatSymbols::setSymbol
          (DecimalFormatSymbols *this,ENumberFormatSymbol symbol,UnicodeString *value,
          UBool propogateDigits)

{
  UChar32 c;
  int32_t iVar1;
  UnicodeString *this_00;
  long lVar2;
  UnicodeString UStack_68;
  
  if (symbol == kIntlCurrencySymbol) {
    this->fIsCustomIntlCurrencySymbol = '\x01';
  }
  else if (symbol == kCurrencySymbol) {
    this->fIsCustomCurrencySymbol = '\x01';
  }
  if ((int)symbol < 0x1c) {
    UnicodeString::operator=((UnicodeString *)(&this->field_0x8 + (ulong)symbol * 0x40),value);
  }
  if (symbol == kZeroDigitSymbol) {
    c = UnicodeString::char32At(value,0);
    if (((propogateDigits != '\0') && (iVar1 = u_charDigitValue_63(c), iVar1 == 0)) &&
       (iVar1 = UnicodeString::countChar32(value,0,0x7fffffff), iVar1 == 1)) {
      this->fCodePointZero = c;
      this_00 = (UnicodeString *)&this->field_0x488;
      lVar2 = 0;
      do {
        UnicodeString::UnicodeString(&UStack_68,c + 1 + (int)lVar2);
        UnicodeString::moveFrom(this_00,&UStack_68);
        UnicodeString::~UnicodeString(&UStack_68);
        this_00 = this_00 + 1;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 9);
      return;
    }
  }
  else if (8 < symbol - kOneDigitSymbol) {
    return;
  }
  this->fCodePointZero = -1;
  return;
}

Assistant:

inline void
DecimalFormatSymbols::setSymbol(ENumberFormatSymbol symbol, const UnicodeString &value, const UBool propogateDigits = TRUE) {
    if (symbol == kCurrencySymbol) {
        fIsCustomCurrencySymbol = TRUE;
    }
    else if (symbol == kIntlCurrencySymbol) {
        fIsCustomIntlCurrencySymbol = TRUE;
    }
    if(symbol<kFormatSymbolCount) {
        fSymbols[symbol]=value;
    }

    // If the zero digit is being set to a known zero digit according to Unicode,
    // then we automatically set the corresponding 1-9 digits
    // Also record updates to fCodePointZero. Be conservative if in doubt.
    if (symbol == kZeroDigitSymbol) {
        UChar32 sym = value.char32At(0);
        if ( propogateDigits && u_charDigitValue(sym) == 0 && value.countChar32() == 1 ) {
            fCodePointZero = sym;
            for ( int8_t i = 1 ; i<= 9 ; i++ ) {
                sym++;
                fSymbols[(int)kOneDigitSymbol+i-1] = UnicodeString(sym);
            }
        } else {
            fCodePointZero = -1;
        }
    } else if (symbol >= kOneDigitSymbol && symbol <= kNineDigitSymbol) {
        fCodePointZero = -1;
    }
}